

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,JavascriptArray *arr)

{
  Type TVar1;
  ScriptContext *requestContext;
  BOOL BVar2;
  Engine *this_00;
  uint32 index;
  Var local_40;
  Var value;
  uint unused;
  
  TVar1 = (arr->super_ArrayObject).length;
  if (TVar1 != 0) {
    requestContext =
         (this->
         super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
         ).super_ScriptContextHolder.m_scriptContext;
    index = 0;
    do {
      local_40 = (void *)0x0;
      BVar2 = JavascriptOperators::GetOwnItem
                        ((RecyclableObject *)arr,index,&local_40,requestContext);
      if (BVar2 == 0) {
        value._4_4_ = 0;
        StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&value + 4));
      }
      else {
        this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                  ::GetEngine(&this->
                               super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                             );
        SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                  (this_00,local_40,(uint *)((long)&value + 4));
      }
      index = index + 1;
    } while (TVar1 != index);
  }
  return;
}

Assistant:

void WriteArrayIndexProperties(JavascriptArray* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            uint32 length = arr->GetLength();

            for (uint32 i = 0; i < length; i++)
            {
                Var value = nullptr;
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    this->GetEngine()->Clone(value);
                }
                else
                {
                    WriteTypeId(SCA_None);
                }
            }
        }